

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnderwaterAcousticEmitterBeam.cpp
# Opt level: O3

void __thiscall
KDIS::DATA_TYPE::UnderwaterAcousticEmitterBeam::Encode
          (UnderwaterAcousticEmitterBeam *this,KDataStream *stream)

{
  KDataStream::Write(stream,this->m_ui8BeamDataLength);
  KDataStream::Write(stream,this->m_ui8BeamIDNumber);
  KDataStream::Write<unsigned_short>(stream,this->m_ui16Padding1);
  (*(this->m_UAFPD).super_DataTypeBase._vptr_DataTypeBase[5])(&this->m_UAFPD,stream);
  return;
}

Assistant:

void UnderwaterAcousticEmitterBeam::Encode( KDataStream & stream ) const
{
    stream << m_ui8BeamDataLength
           << m_ui8BeamIDNumber
           << m_ui16Padding1
           << KDIS_STREAM m_UAFPD;
}